

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::reserve
          (vector<crnlib::color_quad<unsigned_char,_int>_> *this,uint new_capacity)

{
  uint min_new_capacity;
  undefined1 local_28 [8];
  vector<crnlib::color_quad<unsigned_char,_int>_> tmp;
  uint new_capacity_local;
  vector<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  tmp.m_capacity = new_capacity;
  if (this->m_capacity < new_capacity) {
    increase_capacity(this,new_capacity,false,false);
  }
  else if (new_capacity < this->m_capacity) {
    vector((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_28);
    min_new_capacity = math::maximum<unsigned_int>(this->m_size,tmp.m_capacity);
    increase_capacity((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_28,min_new_capacity,
                      false,false);
    operator=((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_28,this);
    swap(this,(vector<crnlib::color_quad<unsigned_char,_int>_> *)local_28);
    ~vector((vector<crnlib::color_quad<unsigned_char,_int>_> *)local_28);
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity)
        {
            if (new_capacity > m_capacity)
            {
                increase_capacity(new_capacity, false);
            }
            else if (new_capacity < m_capacity)
            {
                // Must work around the lack of a "decrease_capacity()" method.
                // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
                vector tmp;
                tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
                tmp = *this;
                swap(tmp);
            }
        }